

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cComputeShaderTests.cpp
# Opt level: O3

GLuint __thiscall
gl4cts::anon_unknown_0::ComputeShaderBase::CreateComputeProgram(ComputeShaderBase *this,string *cs)

{
  GLuint program;
  GLuint shader;
  CallLogWrapper *this_00;
  char *src [2];
  char *local_38;
  pointer local_30;
  
  this_00 = &(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper;
  program = glu::CallLogWrapper::glCreateProgram(this_00);
  if (cs->_M_string_length != 0) {
    shader = glu::CallLogWrapper::glCreateShader(this_00,0x91b9);
    glu::CallLogWrapper::glAttachShader(this_00,program,shader);
    glu::CallLogWrapper::glDeleteShader(this_00,shader);
    local_38 = "#version 430 core\n";
    local_30 = (cs->_M_dataplus)._M_p;
    glu::CallLogWrapper::glShaderSource(this_00,shader,2,&local_38,(GLint *)0x0);
    glu::CallLogWrapper::glCompileShader(this_00,shader);
  }
  return program;
}

Assistant:

GLuint CreateComputeProgram(const std::string& cs)
	{
		const GLuint p = glCreateProgram();

		if (!cs.empty())
		{
			const GLuint sh = glCreateShader(GL_COMPUTE_SHADER);
			glAttachShader(p, sh);
			glDeleteShader(sh);
			const char* const src[2] = { kGLSLVer, cs.c_str() };
			glShaderSource(sh, 2, src, NULL);
			glCompileShader(sh);
		}

		return p;
	}